

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O3

int zig_zag_decode_i64(uint8_t *buffer,int64_t *signed_value)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = *buffer & 0x7f;
  uVar3 = (ulong)uVar2;
  iVar1 = 1;
  if ((char)*buffer < '\0') {
    uVar2 = uVar2 | (buffer[1] & 0x7f) << 7;
    uVar3 = (ulong)uVar2;
    iVar1 = 2;
    if ((char)buffer[1] < '\0') {
      uVar2 = uVar2 | (buffer[2] & 0x7f) << 0xe;
      uVar3 = (ulong)uVar2;
      iVar1 = 3;
      if ((char)buffer[2] < '\0') {
        uVar3 = (ulong)(uVar2 | (buffer[3] & 0x7f) << 0x15);
        iVar1 = 4;
        if ((char)buffer[3] < '\0') {
          uVar3 = uVar3 | (ulong)(buffer[4] & 0x7f) << 0x1c;
          iVar1 = 5;
          if ((char)buffer[4] < '\0') {
            uVar3 = uVar3 | (ulong)(buffer[5] & 0x7f) << 0x23;
            iVar1 = 6;
            if ((char)buffer[5] < '\0') {
              uVar3 = uVar3 | (ulong)(buffer[6] & 0x7f) << 0x2a;
              iVar1 = 7;
              if ((char)buffer[6] < '\0') {
                uVar3 = uVar3 | (ulong)(buffer[7] & 0x7f) << 0x31;
                iVar1 = 8;
                if ((char)buffer[7] < '\0') {
                  uVar3 = uVar3 | (ulong)buffer[8] << 0x38;
                  iVar1 = 9;
                }
              }
            }
          }
        }
      }
    }
  }
  *signed_value = -(ulong)((uint)uVar3 & 1) ^ uVar3 >> 1;
  return iVar1;
}

Assistant:

int zig_zag_decode_i64(const uint8_t* buffer, int64_t* signed_value)
{
    uint64_t v = buffer[0];
    uint64_t value = v & 0x7F;
    int bytesRead = 1;
    if ((v & 0x80) != 0)
    {
        bytesRead = 2;
        v = buffer[1];
        value |= (v & 0x7F) << 7;
        if ((v & 0x80) != 0)
        {
            bytesRead = 3;
            v = buffer[2];
            value |= (v & 0x7F) << 14;
            if ((v & 0x80) != 0)
            {
                bytesRead = 4;
                v = buffer[3];
                value |= (v & 0x7F) << 21;
                if ((v & 0x80) != 0)
                {
                    bytesRead = 5;
                    v = buffer[4];
                    value |= (v & 0x7F) << 28;
                    if ((v & 0x80) != 0)
                    {
                        bytesRead = 6;
                        v = buffer[5];
                        value |= (v & 0x7F) << 35;
                        if ((v & 0x80) != 0)
                        {
                            bytesRead = 7;
                            v = buffer[6];
                            value |= (v & 0x7F) << 42;
                            if ((v & 0x80) != 0)
                            {
                                bytesRead = 8;
                                v = buffer[7];
                                value |= (v & 0x7F) << 49;
                                if ((v & 0x80) != 0)
                                {
                                    bytesRead = 9;
                                    v = buffer[8];
                                    value |= v << 56;
                                }
                            }
                        }
                    }
                }
            }
        }
    }

#if defined(_MSC_VER)
#pragma warning(push)
#pragma warning(disable: 4146) /* C4146: unary minus operator applied to unsigned type, result still unsigned */
#endif
    value = (value >> 1) ^ (-(value & 1));
#if defined(_MSC_VER)
#pragma warning(pop)
#endif
    *signed_value = (int64_t) value;

    return bytesRead;
}